

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O1

void __thiscall URI::buildString(URI *this)

{
  string *psVar1;
  int iVar2;
  string str;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if (this->mModified != false) {
    local_30 = 0;
    local_28 = 0;
    psVar1 = &this->mScheme;
    local_38 = &local_28;
    if ((this->mScheme)._M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)&local_38,(ulong)(psVar1->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_38);
    }
    if ((this->mAuthority)._M_string_length != 0) {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 != 0) {
          std::__cxx11::string::append((char *)&local_38);
        }
      }
      std::__cxx11::string::_M_append((char *)&local_38,(ulong)(this->mAuthority)._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_append((char *)&local_38,(ulong)(this->mPath)._M_dataplus._M_p);
    buildQuery(this);
    if ((this->mQueryString)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_38);
      std::__cxx11::string::_M_append
                ((char *)&local_38,(ulong)(this->mQueryString)._M_dataplus._M_p);
    }
    if ((this->mFragment)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_38);
      std::__cxx11::string::_M_append((char *)&local_38,(ulong)(this->mFragment)._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFullString);
    this->mModified = false;
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  return;
}

Assistant:

void URI::buildString() const
{
	if ( mModified == false )
		return;
	
	string str;
	
	if ( not mScheme.empty() )
	{
		str += mScheme;
		str += ":";
	}
	
	if ( not mAuthority.empty() )
	{
		// These URI's do not add a //
		if ( mScheme != "mailto" && mScheme != "news" )
			str += "//";
		
		str += mAuthority;
	}
		
	str += mPath;
	
	buildQuery();
	
	if ( not mQueryString.empty() )
	{
		str += "?";
		str += mQueryString;
	}
	
	if ( not mFragment.empty() )
	{
		str += "#";
		str += mFragment;
	}
	
	mFullString = str;
	mModified = false;
}